

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  size_t _elemsize;
  int *piVar6;
  void *pvVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  int iVar20;
  uint uVar21;
  undefined1 (*pauVar22) [16];
  int iVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  float *pfVar28;
  Mat *dst;
  float *pfVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  Option *opt_00;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar50;
  float fVar51;
  undefined1 auVar48 [16];
  float fVar52;
  undefined1 auVar49 [16];
  float fVar53;
  float fVar56;
  float fVar57;
  undefined1 auVar54 [16];
  float fVar58;
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar65 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ulong local_478;
  long local_470;
  undefined1 local_468 [16];
  Mat local_418;
  Option *local_3c8;
  Mat *local_3c0;
  Mat local_3b8;
  undefined8 local_370;
  ulong local_368;
  Mat *local_360;
  size_t local_358;
  Mat *local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  undefined1 local_328 [64];
  size_t local_2e8;
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  float afStack_2c0 [2];
  Allocator *local_2b8;
  int iStack_2b0;
  int iStack_2ac;
  undefined1 auStack_2a8 [12];
  size_t local_298 [2];
  undefined1 local_288 [16];
  float afStack_278 [96];
  float afStack_f8 [50];
  
  iVar24 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar5 = bottom_blob->elempack;
  uVar1 = top_blob->w;
  uVar3 = top_blob->h;
  auVar39._4_4_ = uVar3;
  auVar39._0_4_ = uVar1;
  iVar31 = top_blob->c;
  piVar6 = bottom_blob->refcount;
  local_3b8.data = bottom_blob->data;
  local_3b8.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_3b8.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_3b8.allocator = bottom_blob->allocator;
  iVar20 = bottom_blob->h;
  iVar23 = bottom_blob->w;
  uVar12 = bottom_blob->dims;
  uVar13 = bottom_blob->w;
  uVar14 = bottom_blob->h;
  uVar15 = bottom_blob->d;
  local_3b8.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
    iVar23 = bottom_blob->w;
    iVar20 = bottom_blob->h;
  }
  auVar41._8_4_ = 3;
  auVar41._0_8_ = 0x300000003;
  auVar41._12_4_ = 3;
  auVar39._8_8_ = 0;
  auVar39 = vpaddd_avx(auVar39,auVar41);
  auVar42 = vpsrad_avx(auVar39,0x1f);
  auVar42 = vpsrld_avx(auVar42,0x1e);
  local_468 = vpaddd_avx(auVar39,auVar42);
  auVar38._8_4_ = 0xfffffffc;
  auVar38._0_8_ = 0xfffffffcfffffffc;
  auVar38._12_4_ = 0xfffffffc;
  local_288 = vpand_avx(local_468,auVar38);
  local_368 = (ulong)local_288._4_4_;
  local_370 = CONCAT44((int)(local_3b8.cstep >> 0x20),local_288._0_4_);
  auVar42 = local_468;
  local_3b8.elemsize = _elemsize;
  local_3b8.elempack = iVar5;
  local_3b8.dims = uVar12;
  local_3b8.w = uVar13;
  local_3b8.h = uVar14;
  local_3b8.d = uVar15;
  local_3b8.c = iVar24;
  local_360 = bias;
  local_350 = kernel_tm;
  copy_make_border(bottom_blob,&local_3b8,0,(local_288._4_4_ + 2) - iVar20,0,
                   (local_288._0_4_ + 2) - iVar23,0,0.0,opt);
  auVar39 = vpsrad_avx(local_468,2);
  local_2e8 = 0;
  local_328._0_8_ = (void *)0x0;
  local_328._8_4_ = 0;
  local_328._12_4_ = 0;
  local_328._16_8_ = 0;
  local_328._24_4_ = 0;
  local_328._32_8_ = (Allocator *)0x0;
  local_328._40_4_ = 0;
  local_328._44_4_ = 0;
  local_328._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_3c8 = opt;
  local_3c0 = top_blob;
  local_358 = _elemsize;
  Mat::create((Mat *)local_328,auVar39._4_4_ * auVar39._0_4_,0x24,iVar24,_elemsize,iVar5,
              opt->workspace_allocator);
  dst = local_3c0;
  opt_00 = local_3c8;
  if (0 < (long)local_3b8.c) {
    iVar24 = local_3b8.h + 1;
    if (-1 < local_3b8.h + -2) {
      iVar24 = local_3b8.h + -2;
    }
    uVar30 = iVar24 >> 2;
    iVar24 = local_3b8.w + 1;
    if (-1 < local_3b8.w + -2) {
      iVar24 = local_3b8.w + -2;
    }
    uVar21 = iVar24 >> 2;
    iVar24 = uVar21 * uVar30;
    uVar37 = 1;
    if (1 < (int)uVar21) {
      uVar37 = (ulong)uVar21;
    }
    if ((int)uVar30 < 2) {
      uVar30 = 1;
    }
    local_330 = (long)(iVar24 * 8) * 4;
    local_338 = (long)(iVar24 * 0xc) * 4;
    local_348 = (long)(iVar24 * 0x14) * 4;
    local_340 = (long)(iVar24 * 0x10) * 4;
    local_470 = 0;
    auVar42._8_4_ = 0xc0a00000;
    auVar42._0_8_ = 0xc0a00000c0a00000;
    auVar42._12_4_ = 0xc0a00000;
    do {
      if (5 < local_3b8.h) {
        lVar34 = local_328._16_8_ * local_2e8 * local_470;
        local_468._0_8_ =
             (long)local_3b8.data + local_3b8.elemsize * local_3b8.cstep * local_470 + 0x50;
        local_478 = 0;
        uVar26 = 0;
        do {
          if (5 < local_3b8.w) {
            uVar27 = 0;
            uVar32 = local_478;
            pfVar28 = (float *)local_468._0_8_;
            do {
              lVar35 = -0x60;
              pfVar29 = pfVar28;
              do {
                auVar39 = *(undefined1 (*) [16])(pfVar29 + -0x10);
                auVar38 = *(undefined1 (*) [16])(pfVar29 + -0xc);
                auVar41 = *(undefined1 (*) [16])(pfVar29 + -8);
                auVar40 = *(undefined1 (*) [16])(pfVar29 + -4);
                fVar43 = pfVar29[-0x13];
                fVar44 = pfVar29[-0x12];
                fVar45 = pfVar29[-0x11];
                auVar48 = vsubps_avx(auVar39,auVar38);
                auVar54 = vsubps_avx(auVar40,auVar41);
                auVar61 = vsubps_avx(auVar39,auVar41);
                auVar65 = vsubps_avx(auVar40,auVar38);
                auVar60._0_4_ = auVar61._0_4_ + auVar61._0_4_;
                auVar60._4_4_ = auVar61._4_4_ + auVar61._4_4_;
                auVar60._8_4_ = auVar61._8_4_ + auVar61._8_4_;
                auVar60._12_4_ = auVar61._12_4_ + auVar61._12_4_;
                auVar61 = vsubps_avx(auVar65,auVar60);
                fVar46 = *pfVar29;
                fVar8 = pfVar29[1];
                fVar9 = pfVar29[2];
                fVar10 = pfVar29[3];
                *(float *)((long)afStack_278 + lVar35 + 0x60) =
                     auVar38._0_4_ * -5.0 + pfVar29[-0x14] * 4.0 + auVar40._0_4_;
                *(float *)((long)afStack_278 + lVar35 + 100) =
                     auVar38._4_4_ * -5.0 + fVar43 * 4.0 + auVar40._4_4_;
                *(float *)((long)afStack_278 + lVar35 + 0x68) =
                     auVar38._8_4_ * -5.0 + fVar44 * 4.0 + auVar40._8_4_;
                *(float *)((long)afStack_278 + lVar35 + 0x6c) =
                     auVar38._12_4_ * -5.0 + fVar45 * 4.0 + auVar40._12_4_;
                *(float *)((long)afStack_278 + lVar35 + 0xc0) =
                     auVar40._0_4_ + auVar41._0_4_ + (auVar38._0_4_ + auVar39._0_4_) * -4.0;
                *(float *)((long)afStack_278 + lVar35 + 0xc4) =
                     auVar40._4_4_ + auVar41._4_4_ + (auVar38._4_4_ + auVar39._4_4_) * -4.0;
                *(float *)((long)afStack_278 + lVar35 + 200) =
                     auVar40._8_4_ + auVar41._8_4_ + (auVar38._8_4_ + auVar39._8_4_) * -4.0;
                *(float *)((long)afStack_278 + lVar35 + 0xcc) =
                     auVar40._12_4_ + auVar41._12_4_ + (auVar38._12_4_ + auVar39._12_4_) * -4.0;
                *(float *)((long)afStack_278 + lVar35 + 0x120) = auVar54._0_4_ + auVar48._0_4_ * 4.0
                ;
                *(float *)((long)afStack_278 + lVar35 + 0x124) = auVar54._4_4_ + auVar48._4_4_ * 4.0
                ;
                *(float *)((long)afStack_278 + lVar35 + 0x128) = auVar54._8_4_ + auVar48._8_4_ * 4.0
                ;
                *(float *)((long)afStack_278 + lVar35 + 300) = auVar54._12_4_ + auVar48._12_4_ * 4.0
                ;
                *(undefined1 (*) [16])((long)afStack_f8 + lVar35) = auVar61;
                *(float *)((long)afStack_f8 + lVar35 + 0x60) = auVar60._0_4_ + auVar65._0_4_;
                *(float *)((long)afStack_f8 + lVar35 + 100) = auVar60._4_4_ + auVar65._4_4_;
                *(float *)((long)afStack_f8 + lVar35 + 0x68) = auVar60._8_4_ + auVar65._8_4_;
                *(float *)((long)afStack_f8 + lVar35 + 0x6c) = auVar60._12_4_ + auVar65._12_4_;
                *(float *)((long)afStack_f8 + lVar35 + 0xc0) =
                     auVar41._0_4_ * -5.0 + auVar39._0_4_ * 4.0 + fVar46;
                *(float *)((long)afStack_f8 + lVar35 + 0xc4) =
                     auVar41._4_4_ * -5.0 + auVar39._4_4_ * 4.0 + fVar8;
                *(float *)(&stack0xffffffffffffffd0 + lVar35) =
                     auVar41._8_4_ * -5.0 + auVar39._8_4_ * 4.0 + fVar9;
                *(float *)(&stack0xffffffffffffffd4 + lVar35) =
                     auVar41._12_4_ * -5.0 + auVar39._12_4_ * 4.0 + fVar10;
                pfVar29 = pfVar29 + local_3b8.w * 4;
                lVar35 = lVar35 + 0x10;
              } while (lVar35 != 0);
              lVar36 = 0x50;
              lVar35 = uVar32;
              do {
                auVar39 = *(undefined1 (*) [16])((long)&local_2b8 + lVar36);
                auVar38 = *(undefined1 (*) [16])(auStack_2a8 + lVar36);
                auVar41 = *(undefined1 (*) [16])((long)local_298 + lVar36);
                auVar40 = *(undefined1 (*) [16])(local_288 + lVar36);
                auVar65._0_4_ =
                     auVar38._0_4_ * -5.0 + *(float *)((long)&local_2c8 + lVar36) * 4.0 +
                     auVar40._0_4_;
                auVar65._4_4_ =
                     auVar38._4_4_ * -5.0 + *(float *)((long)&local_2c8 + lVar36 + 4) * 4.0 +
                     auVar40._4_4_;
                auVar65._8_4_ =
                     auVar38._8_4_ * -5.0 + *(float *)((long)afStack_2c0 + lVar36) * 4.0 +
                     auVar40._8_4_;
                auVar65._12_4_ =
                     auVar38._12_4_ * -5.0 + *(float *)((long)afStack_2c0 + lVar36 + 4) * 4.0 +
                     auVar40._12_4_;
                auVar71._0_4_ =
                     auVar40._0_4_ + auVar41._0_4_ + (auVar38._0_4_ + auVar39._0_4_) * -4.0;
                auVar71._4_4_ =
                     auVar40._4_4_ + auVar41._4_4_ + (auVar38._4_4_ + auVar39._4_4_) * -4.0;
                auVar71._8_4_ =
                     auVar40._8_4_ + auVar41._8_4_ + (auVar38._8_4_ + auVar39._8_4_) * -4.0;
                auVar71._12_4_ =
                     auVar40._12_4_ + auVar41._12_4_ + (auVar38._12_4_ + auVar39._12_4_) * -4.0;
                auVar48 = vsubps_avx(auVar39,auVar38);
                auVar54 = vsubps_avx(auVar40,auVar41);
                auVar72._0_4_ = auVar54._0_4_ + auVar48._0_4_ * 4.0;
                auVar72._4_4_ = auVar54._4_4_ + auVar48._4_4_ * 4.0;
                auVar72._8_4_ = auVar54._8_4_ + auVar48._8_4_ * 4.0;
                auVar72._12_4_ = auVar54._12_4_ + auVar48._12_4_ * 4.0;
                auVar48 = vsubps_avx(auVar39,auVar41);
                auVar38 = vsubps_avx(auVar40,auVar38);
                auVar61._0_4_ = auVar48._0_4_ + auVar48._0_4_;
                auVar61._4_4_ = auVar48._4_4_ + auVar48._4_4_;
                auVar61._8_4_ = auVar48._8_4_ + auVar48._8_4_;
                auVar61._12_4_ = auVar48._12_4_ + auVar48._12_4_;
                auVar40 = vsubps_avx(auVar38,auVar61);
                auVar54._0_4_ = auVar61._0_4_ + auVar38._0_4_;
                auVar54._4_4_ = auVar61._4_4_ + auVar38._4_4_;
                auVar54._8_4_ = auVar61._8_4_ + auVar38._8_4_;
                auVar54._12_4_ = auVar61._12_4_ + auVar38._12_4_;
                auVar48._0_4_ =
                     auVar41._0_4_ * -5.0 + auVar39._0_4_ * 4.0 +
                     *(float *)((long)afStack_278 + lVar36);
                auVar48._4_4_ =
                     auVar41._4_4_ * -5.0 + auVar39._4_4_ * 4.0 +
                     *(float *)((long)afStack_278 + lVar36 + 4);
                auVar48._8_4_ =
                     auVar41._8_4_ * -5.0 + auVar39._8_4_ * 4.0 +
                     *(float *)((long)afStack_278 + lVar36 + 8);
                auVar48._12_4_ =
                     auVar41._12_4_ * -5.0 + auVar39._12_4_ * 4.0 +
                     *(float *)((long)afStack_278 + lVar36 + 0xc);
                *(undefined1 (*) [16])(local_328._0_8_ + lVar35 + lVar34) = auVar65;
                *(undefined1 (*) [16])(local_328._0_8_ + lVar35 + (long)(iVar24 * 4) * 4 + lVar34) =
                     auVar71;
                *(undefined1 (*) [16])(local_328._0_8_ + lVar35 + local_330 + lVar34) = auVar72;
                *(undefined1 (*) [16])(local_328._0_8_ + lVar35 + local_338 + lVar34) = auVar40;
                *(undefined1 (*) [16])(local_328._0_8_ + lVar35 + local_340 + lVar34) = auVar54;
                *(undefined1 (*) [16])(local_328._0_8_ + lVar35 + local_348 + lVar34) = auVar48;
                lVar36 = lVar36 + 0x60;
                lVar35 = lVar35 + (long)(iVar24 * 0x18) * 4;
              } while (lVar36 != 0x290);
              uVar27 = uVar27 + 1;
              pfVar28 = pfVar28 + 0x10;
              uVar32 = uVar32 + 0x10;
            } while (uVar27 != uVar37);
          }
          uVar26 = uVar26 + 1;
          local_468._0_8_ = (float *)(local_468._0_8_ + (long)local_3b8.w * local_3b8.elemsize * 4);
          local_478 = local_478 + (long)(int)uVar21 * 0x10;
        } while (uVar26 != uVar30);
      }
      local_470 = local_470 + 1;
    } while (local_470 != local_3b8.c);
  }
  piVar6 = (int *)CONCAT44(local_3b8.refcount._4_4_,local_3b8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_3b8.allocator == (Allocator *)0x0) {
        if (local_3b8.data != (void *)0x0) {
          free(local_3b8.data);
        }
      }
      else {
        (*(local_3b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_3b8.cstep = 0;
  local_3b8.data = (void *)0x0;
  local_3b8.refcount._0_4_ = 0;
  local_3b8.refcount._4_4_ = 0;
  local_3b8.elemsize = 0;
  local_3b8.elempack = 0;
  local_3b8.h = 0;
  local_3b8.d = 0;
  local_3b8.c = 0;
  local_3b8.allocator = (Allocator *)0x0;
  local_3b8.dims = 0;
  local_3b8.w = 0;
  local_298[0] = 0;
  local_2d8._0_8_ = (void *)0x0;
  local_2d8._8_4_ = 0;
  local_2d8._12_4_ = 0;
  local_2c8 = 0;
  afStack_2c0[0] = 0.0;
  local_2b8 = (Allocator *)0x0;
  iStack_2b0 = 0;
  iStack_2ac = 0;
  auStack_2a8 = SUB1612((undefined1  [16])0x0,4);
  convolution_winograd_dot_pack4_sse((Mat *)local_328,iVar31,local_350,(Mat *)local_2d8,opt_00);
  local_418.cstep = 0;
  local_418.data = (void *)0x0;
  local_418.refcount._0_4_ = 0;
  local_418.refcount._4_4_ = 0;
  local_418.elemsize = 0;
  local_418.elempack = 0;
  local_418.allocator = (Allocator *)0x0;
  local_418.dims = 0;
  local_418.w = 0;
  local_418.h = 0;
  local_418.d = 0;
  local_418.c = 0;
  uVar2 = dst->w;
  uVar4 = dst->h;
  auVar40._4_4_ = uVar4;
  auVar40._0_4_ = uVar2;
  auVar40._8_8_ = 0;
  auVar39 = vpcmpeqd_avx(auVar40,local_288);
  auVar38 = vpmovsxdq_avx(auVar39);
  auVar39 = vpcmpeqd_avx(auVar42,auVar42);
  if (((auVar39 & ~auVar38) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar39 & ~auVar38,0xf)) {
    if (&local_418 == dst) {
      iVar31 = 0;
      iVar20 = 0;
      goto LAB_00256dc1;
    }
    piVar6 = dst->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_418.data = dst->data;
    local_418.refcount._0_4_ = SUB84(dst->refcount,0);
    local_418.refcount._4_4_ = (undefined4)((ulong)dst->refcount >> 0x20);
    local_418.elemsize = dst->elemsize;
    local_418.elempack = dst->elempack;
    local_418.allocator = dst->allocator;
    uVar16 = dst->dims;
    uVar17 = dst->w;
    uVar18 = dst->h;
    uVar19 = dst->d;
    local_418.c = dst->c;
    local_418.cstep = dst->cstep;
    iVar5 = dst->w;
    iVar24 = dst->h;
    local_418.dims = uVar16;
    local_418.w = uVar17;
    local_418.h = uVar18;
    local_418.d = uVar19;
  }
  else {
    Mat::create(&local_418,(int)local_370,(int)local_368,iVar31,local_358,iVar5,
                opt_00->workspace_allocator);
    iVar5 = local_418.w;
    iVar24 = local_418.h;
  }
  iVar31 = iVar24;
  iVar20 = iVar5;
  if (0 < local_418.c) {
    pvVar7 = local_360->data;
    iVar23 = iVar24 + 3;
    if (-1 < iVar24) {
      iVar23 = iVar24;
    }
    iVar31 = iVar5 + 3;
    if (-1 < iVar5) {
      iVar31 = iVar5;
    }
    uVar30 = iVar31 >> 2;
    iVar25 = uVar30 * (iVar23 >> 2);
    uVar37 = 0;
    do {
      if (pvVar7 == (void *)0x0) {
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
      }
      else {
        pfVar28 = (float *)((long)pvVar7 + uVar37 * 0x10);
        fVar43 = *pfVar28;
        fVar44 = pfVar28[1];
        fVar45 = pfVar28[2];
        fVar46 = pfVar28[3];
      }
      if (3 < iVar24) {
        local_468._0_8_ =
             (long)local_418.data + local_418.elemsize * local_418.cstep * uVar37 + 0x30;
        local_478 = 0;
        uVar26 = 0;
        do {
          if (3 < iVar5) {
            uVar27 = 0;
            uVar32 = local_478;
            pauVar33 = (undefined1 (*) [16])local_468._0_8_;
            do {
              pfVar28 = (float *)(local_2d8._0_8_ +
                                 (uVar32 >> 2 & 0x3fffffff) * 0x10 +
                                 local_2c8 * local_298[0] * uVar37);
              lVar34 = -0x60;
              do {
                auVar39 = *(undefined1 (*) [16])(pfVar28 + iVar25 * 4);
                auVar42 = *(undefined1 (*) [16])(pfVar28 + iVar25 * 8);
                auVar38 = *(undefined1 (*) [16])(pfVar28 + iVar25 * 0xc);
                auVar41 = *(undefined1 (*) [16])(pfVar28 + iVar25 * 0x10);
                fVar63 = auVar42._0_4_ + auVar39._0_4_;
                fVar66 = auVar42._4_4_ + auVar39._4_4_;
                fVar68 = auVar42._8_4_ + auVar39._8_4_;
                fVar70 = auVar42._12_4_ + auVar39._12_4_;
                auVar39 = vsubps_avx(auVar39,auVar42);
                fVar53 = auVar41._0_4_ + auVar38._0_4_;
                fVar56 = auVar41._4_4_ + auVar38._4_4_;
                fVar57 = auVar41._8_4_ + auVar38._8_4_;
                fVar58 = auVar41._12_4_ + auVar38._12_4_;
                fVar47 = pfVar28[1];
                fVar50 = pfVar28[2];
                fVar51 = pfVar28[3];
                auVar42 = vsubps_avx(auVar38,auVar41);
                fVar8 = auVar42._0_4_;
                fVar9 = auVar42._4_4_;
                fVar10 = auVar42._8_4_;
                fVar11 = auVar42._12_4_;
                pfVar29 = pfVar28 + iVar25 * 0x14;
                fVar52 = *pfVar29;
                fVar64 = pfVar29[1];
                fVar67 = pfVar29[2];
                fVar69 = pfVar29[3];
                *(float *)((long)afStack_278 + lVar34 + 0x60) = fVar63 + *pfVar28 + fVar53;
                *(float *)((long)afStack_278 + lVar34 + 100) = fVar66 + fVar47 + fVar56;
                *(float *)((long)afStack_278 + lVar34 + 0x68) = fVar68 + fVar50 + fVar57;
                *(float *)((long)afStack_278 + lVar34 + 0x6c) = fVar70 + fVar51 + fVar58;
                *(float *)((long)afStack_278 + lVar34 + 0xc0) = fVar8 + fVar8 + auVar39._0_4_;
                *(float *)((long)afStack_278 + lVar34 + 0xc4) = fVar9 + fVar9 + auVar39._4_4_;
                *(float *)((long)afStack_278 + lVar34 + 200) = fVar10 + fVar10 + auVar39._8_4_;
                *(float *)((long)afStack_278 + lVar34 + 0xcc) = fVar11 + fVar11 + auVar39._12_4_;
                *(float *)((long)afStack_278 + lVar34 + 0x120) = fVar53 * 4.0 + fVar63;
                *(float *)((long)afStack_278 + lVar34 + 0x124) = fVar56 * 4.0 + fVar66;
                *(float *)((long)afStack_278 + lVar34 + 0x128) = fVar57 * 4.0 + fVar68;
                *(float *)((long)afStack_278 + lVar34 + 300) = fVar58 * 4.0 + fVar70;
                *(float *)((long)afStack_f8 + lVar34) = auVar39._0_4_ + fVar52 + fVar8 * 8.0;
                *(float *)((long)afStack_f8 + lVar34 + 4) = auVar39._4_4_ + fVar64 + fVar9 * 8.0;
                *(float *)((long)afStack_f8 + lVar34 + 8) = auVar39._8_4_ + fVar67 + fVar10 * 8.0;
                *(float *)((long)afStack_f8 + lVar34 + 0xc) = auVar39._12_4_ + fVar69 + fVar11 * 8.0
                ;
                pfVar28 = pfVar28 + iVar25 * 0x18;
                lVar34 = lVar34 + 0x10;
              } while (lVar34 != 0);
              lVar34 = 0x50;
              pauVar22 = pauVar33;
              do {
                auVar39 = *(undefined1 (*) [16])((long)&local_2b8 + lVar34);
                auVar42 = *(undefined1 (*) [16])(auStack_2a8 + lVar34);
                auVar38 = *(undefined1 (*) [16])((long)local_298 + lVar34);
                auVar41 = *(undefined1 (*) [16])(local_288 + lVar34);
                auVar40 = vsubps_avx(auVar39,auVar42);
                fVar56 = auVar41._0_4_ + auVar38._0_4_;
                fVar57 = auVar41._4_4_ + auVar38._4_4_;
                fVar58 = auVar41._8_4_ + auVar38._8_4_;
                fVar63 = auVar41._12_4_ + auVar38._12_4_;
                auVar38 = vsubps_avx(auVar38,auVar41);
                fVar47 = auVar39._0_4_ + fVar43 + auVar42._0_4_;
                fVar50 = auVar39._4_4_ + fVar44 + auVar42._4_4_;
                fVar51 = auVar39._8_4_ + fVar45 + auVar42._8_4_;
                fVar52 = auVar39._12_4_ + fVar46 + auVar42._12_4_;
                auVar55._0_4_ = fVar56 + fVar47 + *(float *)((long)&local_2c8 + lVar34);
                auVar55._4_4_ = fVar57 + fVar50 + *(float *)((long)&local_2c8 + lVar34 + 4);
                auVar55._8_4_ = fVar58 + fVar51 + *(float *)((long)afStack_2c0 + lVar34);
                auVar55._12_4_ = fVar63 + fVar52 + *(float *)((long)afStack_2c0 + lVar34 + 4);
                fVar8 = auVar38._0_4_;
                fVar9 = auVar38._4_4_;
                fVar10 = auVar38._8_4_;
                fVar11 = auVar38._12_4_;
                fVar64 = auVar40._0_4_ + fVar43;
                fVar67 = auVar40._4_4_ + fVar44;
                fVar69 = auVar40._8_4_ + fVar45;
                fVar53 = auVar40._12_4_ + fVar46;
                auVar62._0_4_ = fVar8 + fVar8 + fVar64;
                auVar62._4_4_ = fVar9 + fVar9 + fVar67;
                auVar62._8_4_ = fVar10 + fVar10 + fVar69;
                auVar62._12_4_ = fVar11 + fVar11 + fVar53;
                auVar49._0_4_ = fVar56 * 4.0 + fVar47;
                auVar49._4_4_ = fVar57 * 4.0 + fVar50;
                auVar49._8_4_ = fVar58 * 4.0 + fVar51;
                auVar49._12_4_ = fVar63 * 4.0 + fVar52;
                auVar59._0_4_ = fVar64 + *(float *)((long)afStack_278 + lVar34) + fVar8 * 8.0;
                auVar59._4_4_ = fVar67 + *(float *)((long)afStack_278 + lVar34 + 4) + fVar9 * 8.0;
                auVar59._8_4_ = fVar69 + *(float *)((long)afStack_278 + lVar34 + 8) + fVar10 * 8.0;
                auVar59._12_4_ =
                     fVar53 + *(float *)((long)afStack_278 + lVar34 + 0xc) + fVar11 * 8.0;
                pauVar22[-3] = auVar55;
                pauVar22[-2] = auVar62;
                pauVar22[-1] = auVar49;
                *pauVar22 = auVar59;
                lVar34 = lVar34 + 0x60;
                pauVar22 = (undefined1 (*) [16])(*pauVar22 + (long)(iVar5 * 4) * 4);
              } while (lVar34 != 0x1d0);
              uVar27 = uVar27 + 1;
              uVar32 = uVar32 + 4;
              pauVar33 = pauVar33 + 4;
            } while (uVar27 != uVar30);
          }
          uVar26 = uVar26 + 1;
          local_478 = local_478 + (ulong)uVar30 * 4;
          local_468._0_8_ =
               (undefined1 *)local_468._0_8_ + (long)local_418.w * local_418.elemsize * 4;
        } while (uVar26 != (uint)(iVar23 >> 2));
      }
      uVar37 = uVar37 + 1;
      dst = local_3c0;
      opt_00 = local_3c8;
      iVar31 = local_418.h;
      iVar20 = local_418.w;
    } while (uVar37 != (uint)local_418.c);
  }
LAB_00256dc1:
  copy_cut_border(&local_418,dst,0,iVar31 - dst->h,0,iVar20 - dst->w,opt_00);
  piVar6 = (int *)CONCAT44(local_418.refcount._4_4_,local_418.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_418.allocator == (Allocator *)0x0) {
        if (local_418.data != (void *)0x0) {
          free(local_418.data);
        }
      }
      else {
        (*(local_418.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_2d8._12_4_,local_2d8._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_2b8 == (Allocator *)0x0) {
        if ((void *)local_2d8._0_8_ != (void *)0x0) {
          free((void *)local_2d8._0_8_);
        }
      }
      else {
        (*local_2b8->_vptr_Allocator[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_328._12_4_,local_328._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((Allocator *)local_328._32_8_ == (Allocator *)0x0) {
        if ((void *)local_328._0_8_ != (void *)0x0) {
          free((void *)local_328._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_328._32_8_)[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_3b8.refcount._4_4_,local_3b8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_3b8.allocator == (Allocator *)0x0) {
        if (local_3b8.data != (void *)0x0) {
          free(local_3b8.data);
        }
      }
      else {
        (*(local_3b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 4;
        int h_tiles = outh / 4;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 36, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd43_transform_input_pack4_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack4_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd43_transform_output_pack4_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}